

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::HttpServer::Connection::accept(Connection *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  SourceLocation location;
  StringPtr statusText;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *attachments;
  uint statusCode;
  Connection *pCVar1;
  char *pcVar2;
  bool bVar3;
  int extraout_EAX;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> **ppOVar4;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> **ppOVar5;
  anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2 in_R8;
  bool local_19a;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_178;
  SourceLocation local_160;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_148;
  undefined1 local_140 [24];
  Promise<void> promise;
  size_t sStack_120;
  String local_100;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_e8;
  Fault local_e0;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_d8;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_kj_result_1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller;
  Fault local_c0;
  Fault f_1;
  uint *local_b0;
  DebugComparison<unsigned_int_&,_int> local_a8;
  bool local_79;
  bool _kjCondition_1;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Fault local_50;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *local_48;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_result;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> method;
  HttpHeaders *headers_local;
  Connection *pCStack_20;
  uint statusCode_local;
  Connection *this_local;
  StringPtr statusText_local;
  
  method.field_1 = in_R8;
  headers_local._4_4_ = __fd;
  pCStack_20 = this;
  this_local = (Connection *)__addr;
  statusText_local.content.ptr = (char *)__addr_len;
  local_48 = kj::_::readMaybe<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>(&this->currentMethod)
  ;
  if (local_48 == (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9a,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  ppOVar4 = mv<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>*>(&local_48);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result,*ppOVar4);
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=(&this->currentMethod);
  f.exception._5_1_ =
       OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::is<kj::HttpConnectMethod>
                 ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result);
  f.exception._6_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 5));
  bVar3 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 6))
  ;
  if (!bVar3) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              ((Fault *)&stack0xffffffffffffff88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9c,FAILED,"method.is<HttpConnectMethod>()",
               "_kjCondition,\"only use accept() with CONNECT requests\"",
               (DebugExpression<bool> *)((long)&f.exception + 6),
               (char (*) [40])"only use accept() with CONNECT requests");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff88);
  }
  local_b0 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)((long)&headers_local + 4));
  f_1.exception._4_4_ = 200;
  kj::_::DebugExpression<unsigned_int&>::operator>=
            (&local_a8,(DebugExpression<unsigned_int&> *)&local_b0,(int *)((long)&f_1.exception + 4)
            );
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_a8);
  local_19a = bVar3 && headers_local._4_4_ < 300;
  local_79 = local_19a;
  if (!bVar3 || headers_local._4_4_ >= 300) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[38]>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9d,FAILED,"statusCode >= 200 && statusCode < 300",
               "_kjCondition,\"the statusCode must be 2xx for accept\"",&local_79,
               (char (*) [38])"the statusCode must be 2xx for accept");
    kj::_::Debug::Fault::fatal(&local_c0);
  }
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=(&this->tunnelRejected);
  local_d8 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->tunnelWriteGuard)
  ;
  if (local_d8 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    ppOVar5 = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>*>(&local_d8);
    pcVar2 = statusText_local.content.ptr;
    pCVar1 = this_local;
    statusCode = headers_local._4_4_;
    local_e8 = *ppOVar5;
    _kj_result_1 = local_e8;
    ArrayPtr<const_kj::StringPtr>::ArrayPtr((ArrayPtr<const_kj::StringPtr> *)&promise,(void *)0x0);
    statusText.content.size_ = (size_t)pcVar2;
    statusText.content.ptr = (char *)pCVar1;
    connectionHeaders.size_ = sStack_120;
    connectionHeaders.ptr = (StringPtr *)promise.super_PromiseBase.node.ptr;
    HttpHeaders::serializeResponse
              (&local_100,(HttpHeaders *)method.field_1,statusCode,statusText,connectionHeaders);
    anon_unknown_36::HttpOutputStream::writeHeaders(&this->httpOutput,&local_100);
    String::~String(&local_100);
    anon_unknown_36::HttpOutputStream::flush((HttpOutputStream *)local_140);
    local_148 = _kj_result_1;
    Promise<void>::
    then<kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>
              ((Promise<void> *)(local_140 + 8),(Type *)local_140);
    SourceLocation::SourceLocation
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"accept",0x1fa2,0x14);
    location.function = local_160.function;
    location.fileName = local_160.fileName;
    location.lineNumber = local_160.lineNumber;
    location.columnNumber = local_160.columnNumber;
    Promise<void>::eagerlyEvaluate((Promise<void> *)(local_140 + 0x10),local_140 + 8,location);
    Promise<void>::~Promise((Promise<void> *)(local_140 + 8));
    Promise<void>::~Promise((Promise<void> *)local_140);
    attachments = _kj_result_1;
    mv<kj::Promise<void>>((Promise<void> *)(local_140 + 0x10));
    Own<kj::PromiseFulfiller<void>,decltype(nullptr)>::attach<kj::Promise<void>>
              ((Own<kj::PromiseFulfiller<void>,decltype(nullptr)> *)&local_178,
               (Promise<void> *)attachments);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=(_kj_result_1,&local_178);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::~Own(&local_178);
    Promise<void>::~Promise((Promise<void> *)(local_140 + 0x10));
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf
              ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result);
    return extraout_EAX;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
            (&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fa0,FAILED,"tunnelWriteGuard != nullptr",
             "\"the tunnel stream was not initialized\"",
             (char (*) [38])"the tunnel stream was not initialized");
  kj::_::Debug::Fault::fatal(&local_e0);
}

Assistant:

void accept(uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;
    KJ_ASSERT(method.is<HttpConnectMethod>(), "only use accept() with CONNECT requests");
    KJ_REQUIRE(statusCode >= 200 && statusCode < 300, "the statusCode must be 2xx for accept");
    tunnelRejected = kj::none;

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    httpOutput.writeHeaders(headers.serializeResponse(statusCode, statusText));
    auto promise = httpOutput.flush().then([&fulfiller]() {
      fulfiller->fulfill();
    }).eagerlyEvaluate(nullptr);
    fulfiller = fulfiller.attach(kj::mv(promise));
  }